

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary_search.cpp
# Opt level: O3

int main(void)

{
  uint64_t uVar1;
  initializer_list<long> __l;
  allocator_type local_51;
  vector<long,_std::allocator<long>_> local_50;
  long local_38 [5];
  
  local_38[2] = 3;
  local_38[3] = 4;
  local_38[0] = 1;
  local_38[1] = 2;
  local_38[4] = 5;
  __l._M_len = 5;
  __l._M_array = local_38;
  std::vector<long,_std::allocator<long>_>::vector(&local_50,__l,&local_51);
  uVar1 = binarySearch(&local_50,2);
  if (local_50.super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_50.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  return (int)uVar1;
}

Assistant:

int main()
{
  return binarySearch(std::vector<int64_t>{1,2,3,4,5}, 2);
}